

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void counting_loop_try_mu(test_data *td,int id)

{
  int iVar1;
  int local_1c;
  int local_18;
  int n;
  int i;
  int id_local;
  test_data *td_local;
  
  local_1c = td->loop_count;
  for (local_18 = 0; local_18 != local_1c; local_18 = local_18 + 1) {
    while (iVar1 = nsync::nsync_mu_trylock(&td->mu), iVar1 == 0) {
      sched_yield();
    }
    td->id = id;
    td->i = td->i + 1;
    if (td->id != id) {
      testing_panic("td->id != id");
    }
    local_1c = td->loop_count;
    nsync::nsync_mu_unlock(&td->mu);
  }
  test_data_thread_finished(td);
  return;
}

Assistant:

static void counting_loop_try_mu (test_data *td, int id) {
	int i;
	int n = td->loop_count;
	for (i = 0; i != n; i++) {
		while (!nsync_mu_trylock (&td->mu)) {
			sched_yield ();
		}
		td->id = id;
		td->i++;
		if (td->id != id) {
			testing_panic ("td->id != id");
		}
		n = td->loop_count;
		nsync_mu_unlock (&td->mu);
	}
	test_data_thread_finished (td);
}